

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O2

bool __thiscall
tinyusdz::usdc::USDCReader::Impl::ReconstrcutStageMeta
          (Impl *this,FieldValuePairVector *fvs,StageMetas *metas)

{
  CrateValue *pCVar1;
  undefined8 *puVar2;
  pointer ppVar3;
  undefined8 uVar4;
  char cVar5;
  bool bVar6;
  string *psVar7;
  value_type_conflict1 *pvVar8;
  optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  *poVar9;
  value_type *__x;
  value_type *__x_00;
  value_type_conflict *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  value_type *pvVar11;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
  *__x_01;
  value_type *__x_02;
  ulong uVar12;
  ostream *poVar13;
  bool bVar14;
  long lVar15;
  pointer __lhs;
  long lVar16;
  size_t i;
  ulong uVar17;
  char *pcVar18;
  TypedAttributeWithFallback<double> *pTVar19;
  StringData *this_00;
  bool autoPlay;
  optional<double> vd;
  optional<float> vf;
  optional<tinyusdz::Token> vt;
  string v;
  vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_> subLayerOffsets;
  ostringstream ss_e;
  undefined1 uStack_1ef;
  storage_t<float> sStack_1ec;
  undefined1 local_1e8 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  double local_1b0;
  double dStack_1a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  subLayers;
  
  subLayers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  subLayerOffsets.super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  subLayers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  subLayers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  subLayerOffsets.super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  subLayerOffsets.super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __lhs = (fvs->
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (fvs->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
LAB_001575b7:
  if (__lhs == ppVar3) {
    if (subLayers.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        subLayers.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      if (subLayerOffsets.
          super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          subLayerOffsets.
          super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>._M_impl.
          super__Vector_impl_data._M_start) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar13 = ::std::operator<<((ostream *)&ss_e,"[warn]");
        poVar13 = ::std::operator<<(poVar13,
                                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                   );
        poVar13 = ::std::operator<<(poVar13,":");
        poVar13 = ::std::operator<<(poVar13,"ReconstrcutStageMeta");
        poVar13 = ::std::operator<<(poVar13,"():");
        poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x6de);
        ::std::operator<<(poVar13," ");
        poVar13 = ::std::operator<<((ostream *)&ss_e,
                                    "Corrupted subLayer info? `subLayers` Fileld not found.");
        ::std::operator<<(poVar13,"\n");
        ::std::__cxx11::stringbuf::str();
        PushWarn(this,(string *)&vt);
LAB_00158ffd:
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
      }
    }
    else {
      v._M_dataplus._M_p = (pointer)0x0;
      v._M_string_length = 0;
      v.field_2._M_allocated_capacity = 0;
      lVar16 = 0;
      for (uVar17 = 0;
          uVar12 = (long)subLayers.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)subLayers.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5, uVar17 < uVar12;
          uVar17 = uVar17 + 1) {
        _ss_e = local_1e8 + 8;
        local_1e8._8_8_ = local_1e8._8_8_ & 0xffffffffffffff00;
        local_1e8[0x18] = SUB81(&local_1c0,0);
        local_1e8[0x19] = (undefined1)((ulong)&local_1c0 >> 8);
        local_1e8._26_2_ = (undefined2)((ulong)&local_1c0 >> 0x10);
        local_1e8._28_4_ = (undefined4)((ulong)&local_1c0 >> 0x20);
        local_1e8._32_4_ = 0;
        local_1e8._36_4_ = 0;
        local_1c0._M_local_buf[0] = '\0';
        dStack_1a8 = 1.0;
        local_1b0 = 0.0;
        tinyusdz::value::AssetPath::AssetPath
                  ((AssetPath *)&vt,
                   (string *)
                   ((long)&((subLayers.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar16)
                  );
        tinyusdz::value::AssetPath::operator=((AssetPath *)&ss_e,(AssetPath *)&vt);
        tinyusdz::value::AssetPath::~AssetPath((AssetPath *)&vt);
        ::std::vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_>::push_back
                  ((vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_> *)&v,
                   (value_type *)&ss_e);
        tinyusdz::value::AssetPath::~AssetPath((AssetPath *)&ss_e);
        lVar16 = lVar16 + 0x20;
      }
      if (uVar12 == (long)subLayerOffsets.
                          super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)subLayerOffsets.
                          super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4) {
        lVar16 = 0x40;
        lVar15 = 0;
        for (uVar17 = 0;
            uVar17 < (ulong)((long)subLayerOffsets.
                                   super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)subLayerOffsets.
                                   super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4);
            uVar17 = uVar17 + 1) {
          puVar2 = (undefined8 *)
                   ((long)&(subLayerOffsets.
                            super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_offset + lVar15);
          uVar4 = puVar2[1];
          *(undefined8 *)(v._M_dataplus._M_p + lVar16) = *puVar2;
          *(undefined8 *)(v._M_dataplus._M_p + lVar16 + 8) = uVar4;
          lVar16 = lVar16 + 0x50;
          lVar15 = lVar15 + 0x10;
        }
      }
      std::vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_>::operator=
                ((vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_> *)
                 &metas->subLayers,
                 (vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_> *)&v);
      ::std::vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_>::~vector
                ((vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_> *)&v);
    }
LAB_0015900a:
    ::std::_Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>::
    ~_Vector_base(&subLayerOffsets.
                   super__Vector_base<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>
                 );
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&subLayers);
    return __lhs == ppVar3;
  }
  bVar6 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __lhs,"upAxis");
  if (bVar6) {
    crate::CrateValue::get_value<tinyusdz::Token>((optional<tinyusdz::Token> *)&ss_e,&__lhs->second)
    ;
    nonstd::optional_lite::optional<tinyusdz::Token>::optional<tinyusdz::Token,_0>
              (&vt,(optional<tinyusdz::Token> *)&ss_e);
    nonstd::optional_lite::optional<tinyusdz::Token>::~optional((optional<tinyusdz::Token> *)&ss_e);
    if (vt.has_value_ == false) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar13 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar13 = ::std::operator<<(poVar13,
                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                 );
      poVar13 = ::std::operator<<(poVar13,":");
      poVar13 = ::std::operator<<(poVar13,"ReconstrcutStageMeta");
      poVar13 = ::std::operator<<(poVar13,"():");
      poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x603);
      ::std::operator<<(poVar13," ");
      pcVar18 = "`upAxis` must be `token` type.";
LAB_00158ac6:
      poVar13 = ::std::operator<<((ostream *)&ss_e,pcVar18);
      ::std::operator<<(poVar13,"\n");
      ::std::__cxx11::stringbuf::str();
      PushError(this,&v);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
LAB_00158b17:
      nonstd::optional_lite::optional<tinyusdz::Token>::~optional(&vt);
      goto LAB_0015900a;
    }
    psVar7 = (string *)nonstd::optional_lite::optional<tinyusdz::Token>::value(&vt);
    ::std::__cxx11::string::string((string *)&v,psVar7);
    bVar6 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &v,"Y");
    if (bVar6) {
      _ss_e = 1;
    }
    else {
      bVar6 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&v,"Z");
      if (bVar6) {
        _ss_e = 2;
      }
      else {
        bVar6 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&v,"X");
        if (!bVar6) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar13 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar13 = ::std::operator<<(poVar13,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                     );
          poVar13 = ::std::operator<<(poVar13,":");
          poVar13 = ::std::operator<<(poVar13,"ReconstrcutStageMeta");
          poVar13 = ::std::operator<<(poVar13,"():");
          poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x60f);
          ::std::operator<<(poVar13," ");
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vd,
                           "`upAxis` must be \'X\', \'Y\' or \'Z\' but got \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &autoPlay,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vd,
                           "\'(note: Case sensitive)");
          poVar13 = ::std::operator<<((ostream *)&ss_e,(string *)&autoPlay);
          ::std::operator<<(poVar13,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&autoPlay);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          ::std::__cxx11::string::_M_dispose();
          goto LAB_00158b17;
        }
        _ss_e = _ss_e & 0xffffffff00000000;
      }
    }
    TypedAttributeWithFallback<tinyusdz::Axis>::operator=(&metas->upAxis,(Axis *)&ss_e);
    ::std::__cxx11::string::_M_dispose();
LAB_00157815:
    nonstd::optional_lite::optional<tinyusdz::Token>::~optional(&vt);
  }
  else {
    bVar6 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,"metersPerUnit");
    poVar9 = (optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
              *)&ss_e;
    if (bVar6) {
      pCVar1 = &__lhs->second;
      crate::CrateValue::get_value<float>((optional<float> *)&ss_e,pCVar1);
      vf.has_value_ = (bool)ss_e;
      pTVar19 = &metas->metersPerUnit;
      if (ss_e == (ostringstream)0x1) {
        vf.contained = sStack_1ec;
        pvVar8 = nonstd::optional_lite::optional<float>::value(&vf);
        _ss_e = (pointer)(double)*pvVar8;
      }
      else {
        crate::CrateValue::get_value<double>((optional<double> *)&ss_e,pCVar1);
        vd.has_value_ = (bool)ss_e;
        if (ss_e != (ostringstream)0x1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar13 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar13 = ::std::operator<<(poVar13,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                     );
          poVar13 = ::std::operator<<(poVar13,":");
          poVar13 = ::std::operator<<(poVar13,"ReconstrcutStageMeta");
          poVar13 = ::std::operator<<(poVar13,"():");
          poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x61b);
          ::std::operator<<(poVar13," ");
          linb::any::type_name_abi_cxx11_((string *)&autoPlay,(any *)pCVar1);
          pcVar18 = "`metersPerUnit` value must be double or float type, but got \'";
LAB_00158f74:
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                           pcVar18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&autoPlay);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vt,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                           "\'");
          poVar13 = ::std::operator<<((ostream *)&ss_e,(string *)&vt);
          ::std::operator<<(poVar13,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&vt);
          goto LAB_00158ffd;
        }
        vd.contained = (storage_t<double>)local_1e8._0_8_;
        poVar9 = (optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                  *)nonstd::optional_lite::optional<double>::value(&vd);
      }
    }
    else {
      bVar6 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,"kilogramsPerUnit");
      if (bVar6) {
        pCVar1 = &__lhs->second;
        crate::CrateValue::get_value<float>((optional<float> *)&ss_e,pCVar1);
        vf.has_value_ = (bool)ss_e;
        pTVar19 = &metas->kilogramsPerUnit;
        if (ss_e == (ostringstream)0x1) {
          vf.contained = sStack_1ec;
          pvVar8 = nonstd::optional_lite::optional<float>::value(&vf);
          _ss_e = (pointer)(double)*pvVar8;
        }
        else {
          crate::CrateValue::get_value<double>((optional<double> *)&ss_e,pCVar1);
          vd.has_value_ = (bool)ss_e;
          if (ss_e != (ostringstream)0x1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar13 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar13 = ::std::operator<<(poVar13,
                                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                       );
            poVar13 = ::std::operator<<(poVar13,":");
            poVar13 = ::std::operator<<(poVar13,"ReconstrcutStageMeta");
            poVar13 = ::std::operator<<(poVar13,"():");
            poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x626);
            ::std::operator<<(poVar13," ");
            linb::any::type_name_abi_cxx11_((string *)&autoPlay,(any *)pCVar1);
            pcVar18 = "`kilogramsPerUnit` value must be double or float type, but got \'";
            goto LAB_00158f74;
          }
          vd.contained = (storage_t<double>)local_1e8._0_8_;
          poVar9 = (optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                    *)nonstd::optional_lite::optional<double>::value(&vd);
        }
      }
      else {
        bVar6 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs,"timeCodesPerSecond");
        if (bVar6) {
          pCVar1 = &__lhs->second;
          crate::CrateValue::get_value<float>((optional<float> *)&ss_e,pCVar1);
          vf.has_value_ = (bool)ss_e;
          pTVar19 = &metas->timeCodesPerSecond;
          if (ss_e == (ostringstream)0x1) {
            vf.contained = sStack_1ec;
            pvVar8 = nonstd::optional_lite::optional<float>::value(&vf);
            _ss_e = (pointer)(double)*pvVar8;
          }
          else {
            crate::CrateValue::get_value<double>((optional<double> *)&ss_e,pCVar1);
            vd.has_value_ = (bool)ss_e;
            if (ss_e != (ostringstream)0x1) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
              poVar13 = ::std::operator<<((ostream *)&ss_e,"[error]");
              poVar13 = ::std::operator<<(poVar13,
                                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                         );
              poVar13 = ::std::operator<<(poVar13,":");
              poVar13 = ::std::operator<<(poVar13,"ReconstrcutStageMeta");
              poVar13 = ::std::operator<<(poVar13,"():");
              poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x632);
              ::std::operator<<(poVar13," ");
              linb::any::type_name_abi_cxx11_((string *)&autoPlay,(any *)pCVar1);
              pcVar18 = "`timeCodesPerSecond` value must be double or float type, but got \'";
              goto LAB_00158f74;
            }
            vd.contained = (storage_t<double>)local_1e8._0_8_;
            poVar9 = (optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                      *)nonstd::optional_lite::optional<double>::value(&vd);
          }
        }
        else {
          bVar6 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__lhs,"startTimeCode");
          if (bVar6) {
            pCVar1 = &__lhs->second;
            crate::CrateValue::get_value<float>((optional<float> *)&ss_e,pCVar1);
            vf.has_value_ = (bool)ss_e;
            pTVar19 = &metas->startTimeCode;
            if (ss_e == (ostringstream)0x1) {
              vf.contained = sStack_1ec;
              pvVar8 = nonstd::optional_lite::optional<float>::value(&vf);
              _ss_e = (pointer)(double)*pvVar8;
            }
            else {
              crate::CrateValue::get_value<double>((optional<double> *)&ss_e,pCVar1);
              vd.has_value_ = (bool)ss_e;
              if (ss_e != (ostringstream)0x1) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar13 = ::std::operator<<((ostream *)&ss_e,"[error]");
                poVar13 = ::std::operator<<(poVar13,
                                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                           );
                poVar13 = ::std::operator<<(poVar13,":");
                poVar13 = ::std::operator<<(poVar13,"ReconstrcutStageMeta");
                poVar13 = ::std::operator<<(poVar13,"():");
                poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x63e);
                ::std::operator<<(poVar13," ");
                linb::any::type_name_abi_cxx11_((string *)&autoPlay,(any *)pCVar1);
                pcVar18 = "`startTimeCode` value must be double or float type, but got \'";
                goto LAB_00158f74;
              }
              vd.contained = (storage_t<double>)local_1e8._0_8_;
              poVar9 = (optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                        *)nonstd::optional_lite::optional<double>::value(&vd);
            }
          }
          else {
            bVar6 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)__lhs,"subLayers");
            if (bVar6) {
              crate::CrateValue::
              get_value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        ((optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&ss_e,&__lhs->second);
              vt.has_value_ = (bool)ss_e;
              if (ss_e == (ostringstream)0x1) {
                vt.contained.data.__align = (anon_struct_8_0_00000001_for___align)local_1e8._0_8_;
                vt.contained._8_8_ = local_1e8._8_8_;
                vt.contained._16_8_ = local_1e8._16_8_;
                local_1e8._0_8_ = (storage_t<double>)0x0;
                local_1e8._8_8_ = 0;
                local_1e8._16_8_ = 0;
              }
              nonstd::optional_lite::
              optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~optional((optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&ss_e);
              cVar5 = vt.has_value_;
              if (vt.has_value_ == true) {
                __x = nonstd::optional_lite::
                      optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::value((optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&vt);
                ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator=(&subLayers,__x);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar13 = ::std::operator<<((ostream *)&ss_e,"[error]");
                poVar13 = ::std::operator<<(poVar13,
                                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                           );
                poVar13 = ::std::operator<<(poVar13,":");
                poVar13 = ::std::operator<<(poVar13,"ReconstrcutStageMeta");
                poVar13 = ::std::operator<<(poVar13,"():");
                poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x648);
                ::std::operator<<(poVar13," ");
                linb::any::type_name_abi_cxx11_((string *)&vd,(any *)&__lhs->second);
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&autoPlay,"`subLayers` value must be string[] type, but got \'",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&vd);
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&autoPlay,"\'");
                poVar13 = ::std::operator<<((ostream *)&ss_e,(string *)&v);
                ::std::operator<<(poVar13,"\n");
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::stringbuf::str();
                PushError(this,&v);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
              }
              nonstd::optional_lite::
              optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~optional((optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&vt);
joined_r0x00157d55:
              if (cVar5 != '\0') goto LAB_00157a07;
              goto LAB_0015900a;
            }
            bVar6 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)__lhs,"subLayerOffsets");
            if (bVar6) {
              crate::CrateValue::
              get_value<std::vector<tinyusdz::LayerOffset,std::allocator<tinyusdz::LayerOffset>>>
                        ((optional<std::vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>_>
                          *)&ss_e,&__lhs->second);
              vt.has_value_ = (bool)ss_e;
              if (ss_e == (ostringstream)0x1) {
                vt.contained.data.__align = (anon_struct_8_0_00000001_for___align)local_1e8._0_8_;
                vt.contained._8_8_ = local_1e8._8_8_;
                vt.contained._16_8_ = local_1e8._16_8_;
                local_1e8._0_8_ = (storage_t<double>)0x0;
                local_1e8._8_8_ = 0;
                local_1e8._16_8_ = 0;
              }
              nonstd::optional_lite::
              optional<std::vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>_>
              ::~optional((optional<std::vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>_>
                           *)&ss_e);
              cVar5 = vt.has_value_;
              if (vt.has_value_ == true) {
                __x_00 = nonstd::optional_lite::
                         optional<std::vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>_>
                         ::value((optional<std::vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>_>
                                  *)&vt);
                ::std::vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>::
                operator=(&subLayerOffsets,__x_00);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar13 = ::std::operator<<((ostream *)&ss_e,"[error]");
                poVar13 = ::std::operator<<(poVar13,
                                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                           );
                poVar13 = ::std::operator<<(poVar13,":");
                poVar13 = ::std::operator<<(poVar13,"ReconstrcutStageMeta");
                poVar13 = ::std::operator<<(poVar13,"():");
                poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x651);
                ::std::operator<<(poVar13," ");
                linb::any::type_name_abi_cxx11_((string *)&vd,(any *)&__lhs->second);
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&autoPlay,
                                 "`subLayerOffsets` value must be LayerOffset[] type, but got \'",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&vd);
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&autoPlay,"\'");
                poVar13 = ::std::operator<<((ostream *)&ss_e,(string *)&v);
                ::std::operator<<(poVar13,"\n");
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::stringbuf::str();
                PushError(this,&v);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
              }
              nonstd::optional_lite::
              optional<std::vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>_>
              ::~optional((optional<std::vector<tinyusdz::LayerOffset,_std::allocator<tinyusdz::LayerOffset>_>_>
                           *)&vt);
              goto joined_r0x00157d55;
            }
            bVar6 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)__lhs,"endTimeCode");
            if (!bVar6) {
              bVar6 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)__lhs,"framesPerSecond");
              if (bVar6) {
                pCVar1 = &__lhs->second;
                crate::CrateValue::get_value<float>((optional<float> *)&ss_e,pCVar1);
                vf.has_value_ = (bool)ss_e;
                pTVar19 = &metas->framesPerSecond;
                if (ss_e == (ostringstream)0x1) {
                  vf.contained = sStack_1ec;
                  pvVar8 = nonstd::optional_lite::optional<float>::value(&vf);
                  _ss_e = (pointer)(double)*pvVar8;
                }
                else {
                  crate::CrateValue::get_value<double>((optional<double> *)&ss_e,pCVar1);
                  vd.has_value_ = (bool)ss_e;
                  if (ss_e != (ostringstream)0x1) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                    poVar13 = ::std::operator<<((ostream *)&ss_e,"[error]");
                    poVar13 = ::std::operator<<(poVar13,
                                                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                               );
                    poVar13 = ::std::operator<<(poVar13,":");
                    poVar13 = ::std::operator<<(poVar13,"ReconstrcutStageMeta");
                    poVar13 = ::std::operator<<(poVar13,"():");
                    poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x668);
                    ::std::operator<<(poVar13," ");
                    linb::any::type_name_abi_cxx11_((string *)&autoPlay,(any *)pCVar1);
                    pcVar18 = "`framesPerSecond` value must be double or float type, but got \'";
                    goto LAB_00158f74;
                  }
                  vd.contained = (storage_t<double>)local_1e8._0_8_;
                  poVar9 = (optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                            *)nonstd::optional_lite::optional<double>::value(&vd);
                }
                goto LAB_001579fb;
              }
              bVar6 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)__lhs,"autoPlay");
              if (!bVar6) {
                bVar6 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)__lhs,"playbackMode");
                if (bVar6) {
                  pCVar1 = &__lhs->second;
                  crate::CrateValue::get_value<tinyusdz::Token>
                            ((optional<tinyusdz::Token> *)&ss_e,pCVar1);
                  nonstd::optional_lite::optional<tinyusdz::Token>::optional<tinyusdz::Token,_0>
                            (&vt,(optional<tinyusdz::Token> *)&ss_e);
                  nonstd::optional_lite::optional<tinyusdz::Token>::~optional
                            ((optional<tinyusdz::Token> *)&ss_e);
                  if (vt.has_value_ == true) {
                    pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              nonstd::optional_lite::optional<tinyusdz::Token>::value(&vt);
                    bVar6 = ::std::operator==(pbVar10,"none");
                    if (bVar6) {
                      _ss_e = _ss_e & 0xffffffff00000000;
                    }
                    else {
                      pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )nonstd::optional_lite::optional<tinyusdz::Token>::value(&vt);
                      bVar6 = ::std::operator==(pbVar10,"loop");
                      if (!bVar6) {
                        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                        poVar13 = ::std::operator<<((ostream *)&ss_e,"[error]");
                        poVar13 = ::std::operator<<(poVar13,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                                  );
                        poVar13 = ::std::operator<<(poVar13,":");
                        poVar13 = ::std::operator<<(poVar13,"ReconstrcutStageMeta");
                        poVar13 = ::std::operator<<(poVar13,"():");
                        poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x688);
                        ::std::operator<<(poVar13," ");
                        pcVar18 = "Unsupported token value for `playbackMode`.";
                        goto LAB_00158ac6;
                      }
                      _ss_e = 1;
                    }
                    TypedAttributeWithFallback<tinyusdz::LayerMetas::PlaybackMode>::operator=
                              (&metas->playbackMode,(PlaybackMode *)&ss_e);
                    goto LAB_00157815;
                  }
                  crate::CrateValue::get_value<std::__cxx11::string>
                            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&ss_e,pCVar1);
                  nonstd::optional_lite::
                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::
                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&v,(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&ss_e);
                  nonstd::optional_lite::
                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&ss_e);
                  if ((char)v._M_dataplus._M_p != '\x01') {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                    poVar13 = ::std::operator<<((ostream *)&ss_e,"[error]");
                    poVar13 = ::std::operator<<(poVar13,
                                                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                               );
                    poVar13 = ::std::operator<<(poVar13,":");
                    poVar13 = ::std::operator<<(poVar13,"ReconstrcutStageMeta");
                    poVar13 = ::std::operator<<(poVar13,"():");
                    poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x698);
                    ::std::operator<<(poVar13," ");
                    linb::any::type_name_abi_cxx11_((string *)&vf,(any *)pCVar1);
                    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&vd,"`playbackMode` value must be token type, but got \'",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&vf);
                    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&autoPlay,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&vd,"\'");
                    poVar13 = ::std::operator<<((ostream *)&ss_e,(string *)&autoPlay);
                    ::std::operator<<(poVar13,"\n");
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::_M_dispose();
LAB_001595be:
                    ::std::__cxx11::stringbuf::str();
                    PushError(this,(string *)&autoPlay);
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                    nonstd::optional_lite::
                    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&v);
                    goto LAB_00158b17;
                  }
                  pvVar11 = nonstd::optional_lite::
                            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&v);
                  bVar6 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)pvVar11,"none");
                  if (bVar6) {
                    _ss_e = _ss_e & 0xffffffff00000000;
                  }
                  else {
                    pvVar11 = nonstd::optional_lite::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&v);
                    bVar6 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)pvVar11,"loop");
                    if (!bVar6) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      poVar13 = ::std::operator<<((ostream *)&ss_e,"[error]");
                      poVar13 = ::std::operator<<(poVar13,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                                 );
                      poVar13 = ::std::operator<<(poVar13,":");
                      poVar13 = ::std::operator<<(poVar13,"ReconstrcutStageMeta");
                      poVar13 = ::std::operator<<(poVar13,"():");
                      poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x692);
                      ::std::operator<<(poVar13," ");
                      poVar13 = ::std::operator<<((ostream *)&ss_e,
                                                  "Unsupported value for `playbackMode`: ");
                      pvVar11 = nonstd::optional_lite::
                                optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)&v);
                      poVar13 = ::std::operator<<(poVar13,(string *)pvVar11);
                      ::std::operator<<(poVar13,"\n");
                      goto LAB_001595be;
                    }
                    _ss_e = 1;
                  }
                  TypedAttributeWithFallback<tinyusdz::LayerMetas::PlaybackMode>::operator=
                            (&metas->playbackMode,(PlaybackMode *)&ss_e);
                  nonstd::optional_lite::
                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&v);
                  goto LAB_00157815;
                }
                bVar6 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)__lhs,"defaultPrim");
                if (bVar6) {
                  crate::CrateValue::get_value<tinyusdz::Token>
                            ((optional<tinyusdz::Token> *)&ss_e,&__lhs->second);
                  nonstd::optional_lite::optional<tinyusdz::Token>::optional<tinyusdz::Token,_0>
                            (&vt,(optional<tinyusdz::Token> *)&ss_e);
                  nonstd::optional_lite::optional<tinyusdz::Token>::~optional
                            ((optional<tinyusdz::Token> *)&ss_e);
                  cVar5 = vt.has_value_;
                  if (vt.has_value_ == false) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                    poVar13 = ::std::operator<<((ostream *)&ss_e,"[error]");
                    poVar13 = ::std::operator<<(poVar13,
                                                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                               );
                    poVar13 = ::std::operator<<(poVar13,":");
                    poVar13 = ::std::operator<<(poVar13,"ReconstrcutStageMeta");
                    poVar13 = ::std::operator<<(poVar13,"():");
                    poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x69d);
                    ::std::operator<<(poVar13," ");
                    poVar13 = ::std::operator<<((ostream *)&ss_e,
                                                "`defaultPrim` must be `token` type.");
                    ::std::operator<<(poVar13,"\n");
                    ::std::__cxx11::stringbuf::str();
                    PushError(this,&v);
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                  }
                  else {
                    nonstd::optional_lite::optional<tinyusdz::Token>::value(&vt);
                    ::std::__cxx11::string::_M_assign((string *)&metas->defaultPrim);
                  }
                  nonstd::optional_lite::optional<tinyusdz::Token>::~optional(&vt);
                }
                else {
                  bVar6 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)__lhs,"customLayerData");
                  if (bVar6) {
                    crate::CrateValue::
                    get_value<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
                              ((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                                *)&ss_e,&__lhs->second);
                    nonstd::optional_lite::
                    optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                    ::
                    optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>,_0>
                              ((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                                *)&vt,(optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                                       *)&ss_e);
                    nonstd::optional_lite::
                    optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                    ::~optional((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                                 *)&ss_e);
                    cVar5 = vt.has_value_;
                    if (vt.has_value_ == true) {
                      __x_01 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                *)nonstd::optional_lite::
                                  optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                                  ::value((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                                           *)&vt);
                      std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                      ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                   *)&metas->customLayerData,__x_01);
                    }
                    else {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      poVar13 = ::std::operator<<((ostream *)&ss_e,"[error]");
                      poVar13 = ::std::operator<<(poVar13,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                                 );
                      poVar13 = ::std::operator<<(poVar13,":");
                      poVar13 = ::std::operator<<(poVar13,"ReconstrcutStageMeta");
                      poVar13 = ::std::operator<<(poVar13,"():");
                      poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x6a8);
                      ::std::operator<<(poVar13," ");
                      linb::any::type_name_abi_cxx11_((string *)&autoPlay,(any *)&__lhs->second);
                      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&v,
                                       "customLayerData must be `dictionary` type, but got type `",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&autoPlay);
                      poVar13 = ::std::operator<<((ostream *)&ss_e,(string *)&v);
                      ::std::operator<<(poVar13,"\n");
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::stringbuf::str();
                      PushError(this,&v);
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                    }
                    nonstd::optional_lite::
                    optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                    ::~optional((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                                 *)&vt);
                  }
                  else {
                    bVar6 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)__lhs,"primChildren");
                    if (bVar6) {
                      crate::CrateValue::
                      get_value<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                                ((optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                                  *)&ss_e,&__lhs->second);
                      vt.has_value_ = (bool)ss_e;
                      if (ss_e == (ostringstream)0x1) {
                        vt.contained.data.__align =
                             (anon_struct_8_0_00000001_for___align)local_1e8._0_8_;
                        vt.contained._8_8_ = local_1e8._8_8_;
                        vt.contained._16_8_ = local_1e8._16_8_;
                        local_1e8._0_8_ = (storage_t<double>)0x0;
                        local_1e8._8_8_ = 0;
                        local_1e8._16_8_ = 0;
                      }
                      nonstd::optional_lite::
                      optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::
                      ~optional((optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                                 *)&ss_e);
                      cVar5 = vt.has_value_;
                      if (vt.has_value_ == false) {
                        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                        poVar13 = ::std::operator<<((ostream *)&ss_e,"[error]");
                        poVar13 = ::std::operator<<(poVar13,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                                  );
                        poVar13 = ::std::operator<<(poVar13,":");
                        poVar13 = ::std::operator<<(poVar13,"ReconstrcutStageMeta");
                        poVar13 = ::std::operator<<(poVar13,"():");
                        poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x6ae);
                        ::std::operator<<(poVar13," ");
                        linb::any::type_name_abi_cxx11_((string *)&autoPlay,(any *)&__lhs->second);
                        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&v,"Type must be `token[]` for `primChildren`, but got "
                                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&autoPlay);
                        poVar13 = ::std::operator<<((ostream *)&ss_e,(string *)&v);
                        ::std::operator<<(poVar13,"\n");
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::stringbuf::str();
                        PushError(this,&v);
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                      }
                      else {
                        __x_02 = nonstd::optional_lite::
                                 optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                                 ::value((optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                                          *)&vt);
                        std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                   &metas->primChildren,
                                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                   __x_02);
                      }
                      nonstd::optional_lite::
                      optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::
                      ~optional((optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                                 *)&vt);
                    }
                    else {
                      bVar6 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)__lhs,"documentation");
                      if (bVar6) {
                        crate::CrateValue::get_value<std::__cxx11::string>
                                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&ss_e,&__lhs->second);
                        nonstd::optional_lite::
                        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::
                        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&vt,(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           *)&ss_e);
                        nonstd::optional_lite::
                        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&ss_e);
                        cVar5 = vt.has_value_;
                        if (vt.has_value_ == false) {
                          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                          poVar13 = ::std::operator<<((ostream *)&ss_e,"[error]");
                          poVar13 = ::std::operator<<(poVar13,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                                  );
                          poVar13 = ::std::operator<<(poVar13,":");
                          poVar13 = ::std::operator<<(poVar13,"ReconstrcutStageMeta");
                          poVar13 = ::std::operator<<(poVar13,"():");
                          poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x6b6);
                          ::std::operator<<(poVar13," ");
                          linb::any::type_name_abi_cxx11_((string *)&autoPlay,(any *)&__lhs->second)
                          ;
                          pcVar18 = "Type must be `string` for `documentation`, but got ";
                          goto LAB_0015882b;
                        }
                        _ss_e = local_1e8 + 8;
                        local_1e8._8_8_ = local_1e8._8_8_ & 0xffffffffffffff00;
                        local_1e8[0x18] = 0;
                        local_1e8[0x19] = 0;
                        local_1e8._28_4_ = 0;
                        local_1e8._32_4_ = 0;
                        nonstd::optional_lite::
                        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&vt);
                        ::std::__cxx11::string::_M_assign((string *)&ss_e);
                        local_1e8[0x18] = hasNewline((string *)&ss_e);
                        this_00 = &metas->doc;
LAB_00158631:
                        local_1e8._0_8_ = (storage_t<double>)0x0;
                        tinyusdz::value::StringData::operator=(this_00,(StringData *)&ss_e);
                        ::std::__cxx11::string::_M_dispose();
                      }
                      else {
                        bVar6 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)__lhs,"comment");
                        if (!bVar6) {
                          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                          poVar13 = ::std::operator<<((ostream *)&ss_e,"[warn]");
                          poVar13 = ::std::operator<<(poVar13,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                                  );
                          poVar13 = ::std::operator<<(poVar13,":");
                          poVar13 = ::std::operator<<(poVar13,"ReconstrcutStageMeta");
                          poVar13 = ::std::operator<<(poVar13,"():");
                          poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x6c9);
                          ::std::operator<<(poVar13," ");
                          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&vt,"[StageMeta] TODO: ",
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)__lhs);
                          poVar13 = ::std::operator<<((ostream *)&ss_e,(string *)&vt);
                          ::std::operator<<(poVar13,"\n");
                          ::std::__cxx11::string::_M_dispose();
                          ::std::__cxx11::stringbuf::str();
                          PushWarn(this,(string *)&vt);
                          ::std::__cxx11::string::_M_dispose();
                          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                          goto LAB_00157a07;
                        }
                        crate::CrateValue::get_value<std::__cxx11::string>
                                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&ss_e,&__lhs->second);
                        nonstd::optional_lite::
                        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::
                        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&vt,(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           *)&ss_e);
                        nonstd::optional_lite::
                        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&ss_e);
                        cVar5 = vt.has_value_;
                        if (vt.has_value_ != false) {
                          _ss_e = local_1e8 + 8;
                          local_1e8._8_8_ = local_1e8._8_8_ & 0xffffffffffffff00;
                          local_1e8[0x18] = 0;
                          local_1e8[0x19] = 0;
                          local_1e8._28_4_ = 0;
                          local_1e8._32_4_ = 0;
                          nonstd::optional_lite::
                          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&vt);
                          ::std::__cxx11::string::_M_assign((string *)&ss_e);
                          local_1e8[0x18] = hasNewline((string *)&ss_e);
                          this_00 = &metas->comment;
                          goto LAB_00158631;
                        }
                        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                        poVar13 = ::std::operator<<((ostream *)&ss_e,"[error]");
                        poVar13 = ::std::operator<<(poVar13,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                                  );
                        poVar13 = ::std::operator<<(poVar13,":");
                        poVar13 = ::std::operator<<(poVar13,"ReconstrcutStageMeta");
                        poVar13 = ::std::operator<<(poVar13,"():");
                        poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x6c1);
                        ::std::operator<<(poVar13," ");
                        linb::any::type_name_abi_cxx11_((string *)&autoPlay,(any *)&__lhs->second);
                        pcVar18 = "Type must be `string` for `comment`, but got ";
LAB_0015882b:
                        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&v,pcVar18,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&autoPlay);
                        poVar13 = ::std::operator<<((ostream *)&ss_e,(string *)&v);
                        ::std::operator<<(poVar13,"\n");
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::stringbuf::str();
                        PushError(this,&v);
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                      }
                      nonstd::optional_lite::
                      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&vt);
                    }
                  }
                }
                goto joined_r0x00157d55;
              }
              crate::CrateValue::get_value<bool>((CrateValue *)&ss_e);
              vf.has_value_ = (bool)ss_e;
              if (ss_e == (ostringstream)0x1) {
                vf._1_1_ = uStack_1ef;
                value = nonstd::optional_lite::optional<bool>::value((optional<bool> *)&vf);
                TypedAttributeWithFallback<bool>::operator=(&metas->autoPlay,value);
                goto LAB_00157a07;
              }
              crate::CrateValue::get_value<std::__cxx11::string>
                        ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&ss_e,&__lhs->second);
              nonstd::optional_lite::
              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::
              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vt,(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&ss_e);
              nonstd::optional_lite::
              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&ss_e);
              if (vt.has_value_ == true) {
                autoPlay = true;
                pvVar11 = nonstd::optional_lite::
                          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&vt);
                bVar6 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)pvVar11,"true");
                bVar14 = true;
                if (!bVar6) {
                  pvVar11 = nonstd::optional_lite::
                            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&vt);
                  bVar6 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)pvVar11,"false");
                  if (!bVar6) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                    poVar13 = ::std::operator<<((ostream *)&ss_e,"[error]");
                    poVar13 = ::std::operator<<(poVar13,
                                                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                               );
                    poVar13 = ::std::operator<<(poVar13,":");
                    poVar13 = ::std::operator<<(poVar13,"ReconstrcutStageMeta");
                    poVar13 = ::std::operator<<(poVar13,"():");
                    poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x677);
                    ::std::operator<<(poVar13," ");
                    poVar13 = ::std::operator<<((ostream *)&ss_e,
                                                "Unsupported value for `autoPlay`: ");
                    pvVar11 = nonstd::optional_lite::
                              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&vt);
                    poVar13 = ::std::operator<<(poVar13,(string *)pvVar11);
                    ::std::operator<<(poVar13,"\n");
                    ::std::__cxx11::stringbuf::str();
                    PushError(this,&v);
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                    goto LAB_0015947e;
                  }
                  bVar14 = false;
                }
                autoPlay = bVar14;
                TypedAttributeWithFallback<bool>::operator=(&metas->autoPlay,&autoPlay);
                nonstd::optional_lite::
                optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&vt);
                goto LAB_00157a07;
              }
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
              poVar13 = ::std::operator<<((ostream *)&ss_e,"[error]");
              poVar13 = ::std::operator<<(poVar13,
                                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                         );
              poVar13 = ::std::operator<<(poVar13,":");
              poVar13 = ::std::operator<<(poVar13,"ReconstrcutStageMeta");
              poVar13 = ::std::operator<<(poVar13,"():");
              poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x67e);
              ::std::operator<<(poVar13," ");
              linb::any::type_name_abi_cxx11_((string *)&vd,(any *)&__lhs->second);
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &autoPlay,
                               "`autoPlay` value must be bool type or string type, but got \'",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &vd);
              ::std::operator+(&v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&autoPlay,"\'");
              poVar13 = ::std::operator<<((ostream *)&ss_e,(string *)&v);
              ::std::operator<<(poVar13,"\n");
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::stringbuf::str();
              PushError(this,&v);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
LAB_0015947e:
              nonstd::optional_lite::
              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&vt);
              goto LAB_0015900a;
            }
            pCVar1 = &__lhs->second;
            crate::CrateValue::get_value<float>((optional<float> *)&ss_e,pCVar1);
            vf.has_value_ = (bool)ss_e;
            pTVar19 = &metas->endTimeCode;
            if (ss_e == (ostringstream)0x1) {
              vf.contained = sStack_1ec;
              pvVar8 = nonstd::optional_lite::optional<float>::value(&vf);
              _ss_e = (pointer)(double)*pvVar8;
            }
            else {
              crate::CrateValue::get_value<double>((optional<double> *)&ss_e,pCVar1);
              vd.has_value_ = (bool)ss_e;
              if (ss_e != (ostringstream)0x1) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar13 = ::std::operator<<((ostream *)&ss_e,"[error]");
                poVar13 = ::std::operator<<(poVar13,
                                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                           );
                poVar13 = ::std::operator<<(poVar13,":");
                poVar13 = ::std::operator<<(poVar13,"ReconstrcutStageMeta");
                poVar13 = ::std::operator<<(poVar13,"():");
                poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x65c);
                ::std::operator<<(poVar13," ");
                linb::any::type_name_abi_cxx11_((string *)&autoPlay,(any *)pCVar1);
                pcVar18 = "`endTimeCode` value must be double or float type, but got \'";
                goto LAB_00158f74;
              }
              vd.contained = (storage_t<double>)local_1e8._0_8_;
              poVar9 = (optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                        *)nonstd::optional_lite::optional<double>::value(&vd);
            }
          }
        }
      }
    }
LAB_001579fb:
    TypedAttributeWithFallback<double>::operator=(pTVar19,(double *)poVar9);
  }
LAB_00157a07:
  __lhs = __lhs + 1;
  goto LAB_001575b7;
}

Assistant:

bool USDCReader::Impl::ReconstrcutStageMeta(
    const crate::FieldValuePairVector &fvs, StageMetas *metas) {
  /// Stage(toplevel layer) Meta fieldSet example.
  ///
  ///   specTy = SpecTypePseudoRoot
  ///
  ///     - subLayers(+ subLayerOffsets)
  ///     - customLayerData(dict)
  ///     - defaultPrim(token)
  ///     - metersPerUnit(double)
  ///     - kilogramsPerUnit(double)
  ///     - timeCodesPerSecond(double)
  ///     - upAxis(token)
  ///     - documentation(string) : `doc`
  ///     - comment(string) : comment
  ///     - primChildren(token[]) : Crate only. List of root prims(Root Prim should be traversed based on this array)

  std::vector<std::string> subLayers;
  std::vector<LayerOffset> subLayerOffsets;

  for (const auto &fv : fvs) {
    if (fv.first == "upAxis") {
      auto vt = fv.second.get_value<value::token>();
      if (!vt) {
        PUSH_ERROR_AND_RETURN("`upAxis` must be `token` type.");
      }

      std::string v = vt.value().str();
      if (v == "Y") {
        metas->upAxis = Axis::Y;
      } else if (v == "Z") {
        metas->upAxis = Axis::Z;
      } else if (v == "X") {
        metas->upAxis = Axis::X;
      } else {
        PUSH_ERROR_AND_RETURN("`upAxis` must be 'X', 'Y' or 'Z' but got '" + v +
                              "'(note: Case sensitive)");
      }
      DCOUT("upAxis = " << to_string(metas->upAxis.get_value()));

    } else if (fv.first == "metersPerUnit") {
      if (auto vf = fv.second.get_value<float>()) {
        metas->metersPerUnit = double(vf.value());
      } else if (auto vd = fv.second.get_value<double>()) {
        metas->metersPerUnit = vd.value();
      } else {
        PUSH_ERROR_AND_RETURN(
            "`metersPerUnit` value must be double or float type, but got '" +
            fv.second.type_name() + "'");
      }
      DCOUT("metersPerUnit = " << metas->metersPerUnit.get_value());
    } else if (fv.first == "kilogramsPerUnit") {
      if (auto vf = fv.second.get_value<float>()) {
        metas->kilogramsPerUnit = double(vf.value());
      } else if (auto vd = fv.second.get_value<double>()) {
        metas->kilogramsPerUnit = vd.value();
      } else {
        PUSH_ERROR_AND_RETURN(
            "`kilogramsPerUnit` value must be double or float type, but got '" +
            fv.second.type_name() + "'");
      }
      DCOUT("kilogramsPerUnit = " << metas->kilogramsPerUnit.get_value());
    } else if (fv.first == "timeCodesPerSecond") {
      if (auto vf = fv.second.get_value<float>()) {
        metas->timeCodesPerSecond = double(vf.value());
      } else if (auto vd = fv.second.get_value<double>()) {
        metas->timeCodesPerSecond = vd.value();
      } else {
        PUSH_ERROR_AND_RETURN(
            "`timeCodesPerSecond` value must be double or float "
            "type, but got '" +
            fv.second.type_name() + "'");
      }
      DCOUT("timeCodesPerSecond = " << metas->timeCodesPerSecond.get_value());
    } else if (fv.first == "startTimeCode") {
      if (auto vf = fv.second.get_value<float>()) {
        metas->startTimeCode = double(vf.value());
      } else if (auto vd = fv.second.get_value<double>()) {
        metas->startTimeCode = vd.value();
      } else {
        PUSH_ERROR_AND_RETURN(
            "`startTimeCode` value must be double or float "
            "type, but got '" +
            fv.second.type_name() + "'");
      }
      DCOUT("startimeCode = " << metas->startTimeCode.get_value());
    } else if (fv.first == "subLayers") {
      if (auto vs = fv.second.get_value<std::vector<std::string>>()) {
        subLayers = vs.value();
      } else {
        PUSH_ERROR_AND_RETURN(
            "`subLayers` value must be string[] "
            "type, but got '" +
            fv.second.type_name() + "'");
      }
    } else if (fv.first == "subLayerOffsets") {
      if (auto vs = fv.second.get_value<std::vector<LayerOffset>>()) {
        subLayerOffsets = vs.value();
      } else {
        PUSH_ERROR_AND_RETURN(
            "`subLayerOffsets` value must be LayerOffset[] "
            "type, but got '" +
            fv.second.type_name() + "'");
      }
    } else if (fv.first == "endTimeCode") {
      if (auto vf = fv.second.get_value<float>()) {
        metas->endTimeCode = double(vf.value());
      } else if (auto vd = fv.second.get_value<double>()) {
        metas->endTimeCode = vd.value();
      } else {
        PUSH_ERROR_AND_RETURN(
            "`endTimeCode` value must be double or float "
            "type, but got '" +
            fv.second.type_name() + "'");
      }
      DCOUT("endTimeCode = " << metas->endTimeCode.get_value());
    } else if (fv.first == "framesPerSecond") {
      if (auto vf = fv.second.get_value<float>()) {
        metas->framesPerSecond = double(vf.value());
      } else if (auto vd = fv.second.get_value<double>()) {
        metas->framesPerSecond = vd.value();
      } else {
        PUSH_ERROR_AND_RETURN(
            "`framesPerSecond` value must be double or float "
            "type, but got '" +
            fv.second.type_name() + "'");
      }
      DCOUT("framesPerSecond = " << metas->framesPerSecond.get_value());
    } else if (fv.first == "autoPlay") {
      if (auto vf = fv.second.get_value<bool>()) {
        metas->autoPlay = vf.value();
      } else if (auto vs = fv.second.get_value<std::string>()) {
        // unregisteredvalue uses string type.
        bool autoPlay{true};
        if (vs.value() == "true") {
          autoPlay = true;
        } else if (vs.value() == "false") {
          autoPlay = false;
        } else {
          PUSH_ERROR_AND_RETURN(
              "Unsupported value for `autoPlay`: " << vs.value());
        }
        metas->autoPlay = autoPlay;
      } else {
        PUSH_ERROR_AND_RETURN(
            "`autoPlay` value must be bool "
            "type or string type, but got '" +
            fv.second.type_name() + "'");
      }
      DCOUT("autoPlay = " << metas->autoPlay.get_value());
    } else if (fv.first == "playbackMode") {
      if (auto vf = fv.second.get_value<value::token>()) {
        if (vf.value().str() == "none") {
          metas->playbackMode = StageMetas::PlaybackMode::PlaybackModeNone;
        } else if (vf.value().str() == "loop") {
          metas->playbackMode = StageMetas::PlaybackMode::PlaybackModeLoop;
        } else {
          PUSH_ERROR_AND_RETURN("Unsupported token value for `playbackMode`.");
        }
      } else if (auto vs = fv.second.get_value<std::string>()) {
        // unregisteredvalue uses string type.
        if (vs.value() == "none") {
          metas->playbackMode = StageMetas::PlaybackMode::PlaybackModeNone;
        } else if (vs.value() == "loop") {
          metas->playbackMode = StageMetas::PlaybackMode::PlaybackModeLoop;
        } else {
          PUSH_ERROR_AND_RETURN(
              "Unsupported value for `playbackMode`: " << vs.value());
        }
      } else {
        PUSH_ERROR_AND_RETURN(
            "`playbackMode` value must be token "
            "type, but got '" +
            fv.second.type_name() + "'");
      }
    } else if ((fv.first == "defaultPrim")) {
      auto v = fv.second.get_value<value::token>();
      if (!v) {
        PUSH_ERROR_AND_RETURN("`defaultPrim` must be `token` type.");
      }

      metas->defaultPrim = v.value();
      DCOUT("defaultPrim = " << metas->defaultPrim.str());
    } else if (fv.first == "customLayerData") {
      if (auto v = fv.second.get_value<CustomDataType>()) {
        metas->customLayerData = v.value();
      } else {
        PUSH_ERROR_AND_RETURN(
            "customLayerData must be `dictionary` type, but got type `" +
            fv.second.type_name());
      }
    } else if (fv.first == "primChildren") {  // only appears in USDC.
      auto v = fv.second.get_value<std::vector<value::token>>();
      if (!v) {
        PUSH_ERROR_AND_RETURN("Type must be `token[]` for `primChildren`, but got " +
                   fv.second.type_name());
      }

      metas->primChildren = v.value();
    } else if (fv.first == "documentation") {  // 'doc'
      auto v = fv.second.get_value<std::string>();
      if (!v) {
        PUSH_ERROR_AND_RETURN("Type must be `string` for `documentation`, but got " +
                   fv.second.type_name());
      }
      value::StringData sdata;
      sdata.value = v.value();
      sdata.is_triple_quoted = hasNewline(sdata.value);
      metas->doc = sdata;
      DCOUT("doc = " << metas->doc.value);
    } else if (fv.first == "comment") {  // 'comment'
      auto v = fv.second.get_value<std::string>();
      if (!v) {
        PUSH_ERROR_AND_RETURN("Type must be `string` for `comment`, but got " +
                   fv.second.type_name());
      }
      value::StringData sdata;
      sdata.value = v.value();
      sdata.is_triple_quoted = hasNewline(sdata.value);
      metas->comment = sdata;
      DCOUT("comment = " << metas->comment.value);
    } else {
      PUSH_WARN("[StageMeta] TODO: " + fv.first);
    }
  }

  if (subLayers.size()) {
    std::vector<SubLayer> dst;
    for (size_t i = 0; i < subLayers.size(); i++) {
      SubLayer s;
      s.assetPath = subLayers[i];
      dst.push_back(s);
    }

    if (subLayers.size() == subLayerOffsets.size()) {
      for (size_t i = 0; i < subLayerOffsets.size(); i++) {
        dst[i].layerOffset = subLayerOffsets[i];
      }
    }

    metas->subLayers = dst;

  } else if (subLayerOffsets.size()) {
    PUSH_WARN("Corrupted subLayer info? `subLayers` Fileld not found.");
  }

  return true;
}